

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlAutoCloseTag(htmlDocPtr doc,xmlChar *name,htmlNodePtr elem)

{
  int iVar1;
  htmlNodePtr local_30;
  htmlNodePtr child;
  htmlNodePtr elem_local;
  xmlChar *name_local;
  htmlDocPtr doc_local;
  
  if (elem == (htmlNodePtr)0x0) {
    doc_local._4_4_ = 1;
  }
  else {
    iVar1 = xmlStrEqual(name,elem->name);
    if (iVar1 == 0) {
      iVar1 = htmlCheckAutoClose(elem->name,name);
      if (iVar1 == 0) {
        for (local_30 = elem->children; local_30 != (htmlNodePtr)0x0; local_30 = local_30->next) {
          iVar1 = htmlAutoCloseTag(doc,name,local_30);
          if (iVar1 != 0) {
            return 1;
          }
        }
        doc_local._4_4_ = 0;
      }
      else {
        doc_local._4_4_ = 1;
      }
    }
    else {
      doc_local._4_4_ = 0;
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
htmlAutoCloseTag(htmlDocPtr doc, const xmlChar *name, htmlNodePtr elem) {
    htmlNodePtr child;

    if (elem == NULL) return(1);
    if (xmlStrEqual(name, elem->name)) return(0);
    if (htmlCheckAutoClose(elem->name, name)) return(1);
    child = elem->children;
    while (child != NULL) {
        if (htmlAutoCloseTag(doc, name, child)) return(1);
	child = child->next;
    }
    return(0);
}